

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufref.c
# Opt level: O3

void Curl_bufref_init(bufref *br)

{
  br->dtor = (_func_void_void_ptr *)0x0;
  br->ptr = (uchar *)0x0;
  br->len = 0;
  return;
}

Assistant:

void Curl_bufref_init(struct bufref *br)
{
  DEBUGASSERT(br);
  br->dtor = NULL;
  br->ptr = NULL;
  br->len = 0;

#ifdef DEBUGBUILD
  br->signature = SIGNATURE;
#endif
}